

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O2

void update_stuff(player *p)

{
  uint32_t *puVar1;
  byte *pbVar2;
  wchar_t *pwVar3;
  bitflag *flags;
  byte bVar4;
  wchar_t wVar5;
  _Bool _Var6;
  _Bool _Var7;
  int iVar8;
  wchar_t wVar9;
  object *poVar10;
  class_spell_conflict *pcVar11;
  magic_realm *pmVar12;
  player_upkeep *ppVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  wchar_t wVar17;
  char *pcVar18;
  uint uVar19;
  magic_realm *p_00;
  long lVar20;
  uint uVar21;
  short local_2b8;
  player_state_conflict state;
  wchar_t count;
  wchar_t local_dc;
  wchar_t local_d0;
  
  ppVar13 = p->upkeep;
  uVar19 = ppVar13->update;
  if (uVar19 == 0) {
    return;
  }
  if ((uVar19 >> 10 & 1) != 0) {
    ppVar13->update = uVar19 & 0xfffffbff;
    calc_inventory(p);
    ppVar13 = p->upkeep;
    uVar19 = ppVar13->update;
  }
  if ((uVar19 & 1) == 0) goto LAB_001acf7c;
  ppVar13->update = uVar19 & 0xfffffffe;
  memcpy(&state,&p->state,0x13c);
  memcpy((player_state_conflict *)&count,&p->known_state,0x13c);
  calc_bonuses(p,&state,false,true);
  calc_bonuses(p,(player_state_conflict *)&count,true,true);
  for (lVar20 = 0; lVar20 != 0x14; lVar20 = lVar20 + 4) {
    if (*(int *)((long)state.stat_top + lVar20) != *(int *)((long)(p->state).stat_top + lVar20)) {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)state.stat_use + lVar20) != *(int *)((long)(p->state).stat_use + lVar20)) {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)state.stat_ind + lVar20) != *(int *)((long)(p->state).stat_ind + lVar20)) {
      uVar19 = p->upkeep->update;
      uVar21 = uVar19 | 4;
      if (lVar20 != 0x10) {
        uVar21 = uVar19;
      }
      p->upkeep->update = uVar21 | 0x18;
    }
  }
  _Var6 = flag_has_dbg(state.flags,6,0xd,"state.flags","OF_TELEPATHY");
  flags = (p->state).flags;
  _Var7 = flag_has_dbg(flags,6,0xd,"p->state.flags","OF_TELEPATHY");
  if (_Var6 != _Var7) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  _Var6 = flag_has_dbg(state.flags,6,0xe,"state.flags","OF_SEE_INVIS");
  _Var7 = flag_has_dbg(flags,6,0xe,"p->state.flags","OF_SEE_INVIS");
  if (_Var6 != _Var7) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  if (state.speed != (p->state).speed) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x400;
  }
  if (local_dc == (p->known_state).ac) {
    ppVar13 = p->upkeep;
    if (local_d0 != (p->known_state).to_a) goto LAB_001acdce;
  }
  else {
    ppVar13 = p->upkeep;
LAB_001acdce:
    *(byte *)&ppVar13->redraw = (byte)ppVar13->redraw | 0x20;
  }
  if ((p->state).cur_light != state.cur_light) {
    *(byte *)&ppVar13->update = (byte)ppVar13->update | 0xc0;
  }
  if (adj_str_wgt[(p->state).stat_ind[0]] != adj_str_wgt[state.stat_ind[0]]) {
    pbVar2 = (byte *)((long)&ppVar13->redraw + 2);
    *pbVar2 = *pbVar2 | 2;
  }
  if (ppVar13->only_partial == false) {
    if ((p->state).heavy_shoot != state.heavy_shoot) {
      if (state.heavy_shoot == false) {
        poVar10 = equipped_item_by_slot_name(p,"shooting");
        pcVar18 = "You have no trouble wielding your bow.";
        if (poVar10 == (object *)0x0) {
          pcVar18 = "You feel relieved to put down your heavy bow.";
        }
      }
      else {
        pcVar18 = "You have trouble wielding such a heavy bow.";
      }
      msg(pcVar18);
    }
    if ((p->state).heavy_wield != state.heavy_wield) {
      if (state.heavy_wield == false) {
        poVar10 = equipped_item_by_slot_name(p,"weapon");
        pcVar18 = "You have no trouble wielding your weapon.";
        if (poVar10 == (object *)0x0) {
          pcVar18 = "You feel relieved to put down your heavy weapon.";
        }
      }
      else {
        pcVar18 = "You have trouble wielding such a heavy weapon.";
      }
      msg(pcVar18);
    }
    if ((p->state).bless_wield != state.bless_wield) {
      if (state.bless_wield == false) {
        poVar10 = equipped_item_by_slot_name(p,"weapon");
        if (poVar10 == (object *)0x0) goto LAB_001aceda;
        pcVar18 = "You feel less attuned to your weapon.";
      }
      else {
        pcVar18 = "You feel attuned to your weapon.";
      }
      msg(pcVar18);
    }
LAB_001aceda:
    if ((p->state).cumber_armor != state.cumber_armor) {
      pcVar18 = "You feel able to move more freely.";
      if (state.cumber_armor != false) {
        pcVar18 = "The weight of your armor encumbers your movement.";
      }
      msg(pcVar18);
    }
    if (((p->state).shield_on_back != state.shield_on_back) &&
       (poVar10 = equipped_item_by_slot_name(p,"arm"), poVar10 != (object *)0x0)) {
      pcVar18 = "You are carrying your shield in your hand.";
      if (state.shield_on_back != false) {
        pcVar18 = "You are carrying your shield on your back.";
      }
      msg(pcVar18);
    }
  }
  memcpy(&p->state,&state,0x13c);
  memcpy(&p->known_state,&count,0x13c);
  ppVar13 = p->upkeep;
  uVar19 = ppVar13->update;
LAB_001acf7c:
  if ((uVar19 & 2) != 0) {
    ppVar13->update = uVar19 & 0xfffffffd;
    calc_light(p,&p->state,true);
    ppVar13 = p->upkeep;
    uVar19 = ppVar13->update;
  }
  if ((uVar19 & 4) != 0) {
    ppVar13->update = uVar19 & 0xfffffffb;
    iVar14 = (int)p->lev;
    iVar8 = (int)(((long)adj_con_mhp[(p->state).stat_ind[4]] * (long)iVar14) / 100) +
            (int)p->player_hp[(long)iVar14 + -1];
    iVar16 = iVar14 + 1;
    if (iVar14 < iVar8) {
      iVar16 = iVar8;
    }
    _Var6 = flag_has_dbg((p->state).pflags,10,0x48,"p->state.pflags","(PF_ATHLETICS)");
    if (_Var6) {
      iVar16 = iVar16 + iVar16 / 0x14;
    }
    if (iVar16 == p->mhp) {
      ppVar13 = p->upkeep;
    }
    else {
      p->mhp = (int16_t)iVar16;
      if (iVar16 <= p->chp) {
        p->chp = (int16_t)iVar16;
        p->chp_frac = 0;
      }
      ppVar13 = p->upkeep;
      ppVar13->redraw = ppVar13->redraw | 0x40;
    }
  }
  uVar19 = ppVar13->update;
  if ((uVar19 & 8) != 0) {
    ppVar13->update = uVar19 & 0xfffffff7;
    calc_mana(p,&p->state,true);
    ppVar13 = p->upkeep;
    uVar19 = ppVar13->update;
  }
  if ((uVar19 & 0x10) != 0) {
    ppVar13->update = uVar19 & 0xffffffef;
    wVar17 = (p->class->magic).total_spells;
    lVar20 = (long)wVar17;
    if (((0 < lVar20) && (character_generated == true)) && (ppVar13->only_partial == false)) {
      wVar5 = ppVar13->new_spells;
      iVar8 = (int)p->lev - (p->class->magic).spell_first;
      iVar16 = -1;
      if (-1 < iVar8) {
        iVar16 = iVar8;
      }
      wVar9 = average_spell_stat(p,&p->state);
      iVar8 = 0;
      for (lVar15 = 0; lVar20 != lVar15; lVar15 = lVar15 + 1) {
        iVar8 = iVar8 + (p->spell_flags[lVar15] & 1);
      }
      p->upkeep->new_spells = ((iVar16 + 1) * adj_mag_study[wVar9] + 0x32) / 100 - iVar8;
      uVar21 = wVar17 + L'\xffffffff';
      for (uVar19 = uVar21; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
        wVar17 = (wchar_t)p->spell_order[uVar19];
        if (((uint)wVar17 < 99) &&
           (pcVar11 = spell_by_index(p,wVar17), (int)p->lev < pcVar11->slevel)) {
          bVar4 = p->spell_flags[(uint)wVar17];
          if ((bVar4 & 1) != 0) {
            p->spell_flags[(uint)wVar17] = bVar4 | 4;
            p->spell_flags[(uint)wVar17] = p->spell_flags[(uint)wVar17] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar11->realm->spell_noun,pcVar11->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\x01';
          }
        }
      }
      while ((-1 < (int)uVar21 && (p->upkeep->new_spells < L'\0'))) {
        wVar17 = (wchar_t)p->spell_order[uVar21];
        if ((uint)wVar17 < 99) {
          pcVar11 = spell_by_index(p,wVar17);
          bVar4 = p->spell_flags[(uint)wVar17];
          if ((bVar4 & 1) != 0) {
            p->spell_flags[(uint)wVar17] = bVar4 | 4;
            p->spell_flags[(uint)wVar17] = p->spell_flags[(uint)wVar17] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar11->realm->spell_noun,pcVar11->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\x01';
          }
        }
        uVar21 = uVar21 - 1;
      }
      for (lVar15 = 0;
          ((lVar20 != lVar15 && (L'\0' < p->upkeep->new_spells)) &&
          (wVar17 = (wchar_t)p->spell_order[lVar15], (uint)wVar17 < 99)); lVar15 = lVar15 + 1) {
        pcVar11 = spell_by_index(p,wVar17);
        if (pcVar11->slevel <= (int)p->lev) {
          bVar4 = p->spell_flags[(uint)wVar17];
          if ((bVar4 & 4) != 0) {
            p->spell_flags[(uint)wVar17] = bVar4 & 0xfb;
            p->spell_flags[(uint)wVar17] = p->spell_flags[(uint)wVar17] | 1;
            msg("You have remembered the %s of %s.",pcVar11->realm->spell_noun,pcVar11->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\xffffffff';
          }
        }
      }
      wVar17 = L'\0';
      for (lVar15 = 0; lVar20 != lVar15; lVar15 = lVar15 + 1) {
        pcVar11 = spell_by_index(p,(wchar_t)lVar15);
        if (((pcVar11 != (class_spell_conflict *)0x0) && (pcVar11->slevel != 0)) &&
           (pcVar11->slevel <= (int)p->lev)) {
          wVar17 = wVar17 + (~(uint)p->spell_flags[lVar15] & 1);
        }
      }
      ppVar13 = p->upkeep;
      wVar9 = ppVar13->new_spells;
      if (wVar17 < ppVar13->new_spells) {
        ppVar13->new_spells = wVar17;
        wVar9 = wVar17;
      }
      local_2b8 = (short)wVar5;
      if (local_2b8 != wVar9) {
        if (wVar9 != L'\0') {
          pmVar12 = class_magic_realms(p->class,&count);
          my_strcpy((char *)&state,pmVar12->spell_noun,0x78);
          if (L'\x01' < p->upkeep->new_spells) {
            my_strcat((char *)&state,"s",0x78);
          }
          p_00 = pmVar12->next;
          mem_free(pmVar12);
          if (p_00 != (magic_realm *)0x0 && L'\x01' < count) {
            do {
              count = count + L'\xffffffff';
              pcVar18 = " or ";
              if (count != L'\0') {
                pcVar18 = ", ";
              }
              my_strcat((char *)&state,pcVar18,0x78);
              my_strcat((char *)&state,p_00->spell_noun,0x78);
              if (L'\x01' < p->upkeep->new_spells) {
                my_strcat((char *)&state,"s",0x78);
              }
              pmVar12 = p_00->next;
              mem_free(p_00);
              p_00 = pmVar12;
            } while (pmVar12 != (magic_realm *)0x0);
          }
          msg("You can learn %d more %s.",(ulong)(uint)p->upkeep->new_spells,&state);
          ppVar13 = p->upkeep;
        }
        ppVar13->redraw = ppVar13->redraw | 0x200800;
      }
    }
  }
  if ((ppVar13->update & 0x20) != 0) {
    ppVar13->update = ppVar13->update & 0xffffffdf;
    calc_specialty(p);
  }
  if ((character_generated == true) && (_Var6 = map_is_visible(), _Var6)) {
    ppVar13 = p->upkeep;
    uVar19 = ppVar13->update;
    if ((uVar19 & 0x40) != 0) {
      ppVar13->update = uVar19 & 0xffffffbf;
      update_view(cave,p);
      ppVar13 = p->upkeep;
      uVar19 = ppVar13->update;
    }
    if ((uVar19 >> 8 & 1) != 0) {
      ppVar13->update = uVar19 & 0xfffffe7f;
      update_monsters(true);
      ppVar13 = p->upkeep;
      uVar19 = ppVar13->update;
    }
    if ((char)uVar19 < '\0') {
      ppVar13->update = uVar19 & 0xffffff7f;
      update_monsters(false);
      ppVar13 = p->upkeep;
      uVar19 = ppVar13->update;
    }
    if ((uVar19 >> 9 & 1) != 0) {
      ppVar13->update = uVar19 & 0xfffffdff;
      event_signal(EVENT_PLAYERMOVED);
    }
  }
  return;
}

Assistant:

void update_stuff(struct player *p)
{
	/* Update stuff */
	if (!p->upkeep->update) return;


	if (p->upkeep->update & (PU_INVEN)) {
		p->upkeep->update &= ~(PU_INVEN);
		calc_inventory(p);
	}

	if (p->upkeep->update & (PU_BONUS)) {
		p->upkeep->update &= ~(PU_BONUS);
		update_bonuses(p);
	}

	if (p->upkeep->update & (PU_TORCH)) {
		p->upkeep->update &= ~(PU_TORCH);
		calc_light(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_HP)) {
		p->upkeep->update &= ~(PU_HP);
		calc_hitpoints(p);
	}

	if (p->upkeep->update & (PU_MANA)) {
		p->upkeep->update &= ~(PU_MANA);
		calc_mana(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_SPELLS)) {
		p->upkeep->update &= ~(PU_SPELLS);
		if (p->class->magic.total_spells > 0) {
			calc_spells(p);
		}
	}

	if (p->upkeep->update & (PU_SPECIALTY)) {
		p->upkeep->update &= ~(PU_SPECIALTY);
		calc_specialty(p);
	}

	/* Character is not ready yet, no map updates */
	if (!character_generated) return;

	/* Map is not shown, no map updates */
	if (!map_is_visible()) return;

	if (p->upkeep->update & (PU_UPDATE_VIEW)) {
		p->upkeep->update &= ~(PU_UPDATE_VIEW);
		update_view(cave, p);
	}

	if (p->upkeep->update & (PU_DISTANCE)) {
		p->upkeep->update &= ~(PU_DISTANCE);
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(true);
	}

	if (p->upkeep->update & (PU_MONSTERS)) {
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(false);
	}


	if (p->upkeep->update & (PU_PANEL)) {
		p->upkeep->update &= ~(PU_PANEL);
		event_signal(EVENT_PLAYERMOVED);
	}
}